

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::SingularMessage::GenerateMessageClearingCode
          (SingularMessage *this,Printer *p)

{
  undefined8 uVar1;
  undefined1 *puVar2;
  char *pcVar3;
  undefined1 local_10 [16];
  
  if (this->has_hasbit_ != false) {
    google::protobuf::io::Printer::Emit
              (p,0,0,0x47,
               "\n        $DCHK$($field_$ != nullptr);\n        $field_$->Clear();\n      ");
    return;
  }
  puVar2 = local_10;
  (anonymous_namespace)::SingularMessage::GenerateMessageClearingCode();
  if (puVar2[0x4c] == '\x01') {
    pcVar3 = 
    "\n          if (_this->$field_$ == nullptr) {\n            _this->$field_$ = from.$field_$->New(arena);\n          }\n          _this->$field_$->CheckTypeAndMergeFrom(*from.$field_$);\n        "
    ;
    uVar1 = 0xbc;
  }
  else if (puVar2[0x40] == '\x01') {
    pcVar3 = 
    "\n          _this->_internal_mutable_$name$()->$Submsg$::MergeFrom(\n              from._internal_$name$());\n        "
    ;
    uVar1 = 0x73;
  }
  else {
    pcVar3 = 
    "\n      $DCHK$(from.$field_$ != nullptr);\n      if (_this->$field_$ == nullptr) {\n        _this->$field_$ =\n            $superclass$::CopyConstruct<$Submsg$>(arena, *from.$field_$);\n      } else {\n        _this->$field_$->MergeFrom(*from.$field_$);\n      }\n    "
    ;
    uVar1 = 0x104;
  }
  google::protobuf::io::Printer::Emit(p,0,0,uVar1,pcVar3);
  return;
}

Assistant:

void SingularMessage::GenerateMessageClearingCode(io::Printer* p) const {
  ABSL_CHECK(has_hasbit_);
  p->Emit(
      R"cc(
        $DCHK$($field_$ != nullptr);
        $field_$->Clear();
      )cc");
}